

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::ReportMissing(cmFileCopier *this,string *fromFile)

{
  cmExecutionStatus *pcVar1;
  char local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = this->Status;
  cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
  local_61 = '.';
  cmStrCat<char_const*&,char_const(&)[15],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char>
            (&local_60,&this->Name,(char (*) [15])" cannot find \"",fromFile,(char (*) [4])0x7ad35b,
             &local_40,&local_61);
  std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return false;
}

Assistant:

bool cmFileCopier::ReportMissing(const std::string& fromFile)
{
  // The input file does not exist and installation is not optional.
  this->Status.SetError(cmStrCat(this->Name, " cannot find \"", fromFile,
                                 "\": ", cmSystemTools::GetLastSystemError(),
                                 '.'));
  return false;
}